

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Call.hpp
# Opt level: O3

void __thiscall
Call<void>::
Args5<int,_const_String_&,_const_String_&,_const_String_&,_const_String_&,_int,_String,_String,_String,_String>
::Args5(Args5<int,_const_String_&,_const_String_&,_const_String_&,_const_String_&,_int,_String,_String,_String,_String>
        *this,_func_void_int_String_ptr_String_ptr_String_ptr_String_ptr *a,int *p,String *q,
       String *r,String *s,String *t,void *z)

{
  (this->super_Func5<int,_const_String_&,_const_String_&,_const_String_&,_const_String_&>).a = a;
  this->p = *p;
  String::String(&this->q,q);
  String::String(&this->r,r);
  String::String(&this->s,s);
  String::String(&this->t,t);
  this->z = z;
  return;
}

Assistant:

Args5(A (*a)(D, E, F, G, H), const P& p, const Q& q, const R& r, const S& s, const T& t, void* z) : Func5<D, E, F, G, H>(a), p(p), q(q), r(r), s(s), t(t), z(z) {}